

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
toml::result<toml::basic_value<toml::type_config>_*,_toml::error_info>::cleanup
          (result<toml::basic_value<toml::type_config>_*,_toml::error_info> *this,EVP_PKEY_CTX *ctx)

{
  if (this->is_ok_ != false) {
    return;
  }
  error_info::~error_info((error_info *)&(this->field_1).succ_);
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }